

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

Storage * __thiscall llvm::APFloat::Storage::operator=(Storage *this,Storage *RHS)

{
  if ((*(undefined1 **)this == semPPCDoubleDouble) ||
     (RHS->semantics == (fltSemantics *)semPPCDoubleDouble)) {
    if ((*(undefined1 **)this == semPPCDoubleDouble) &&
       (RHS->semantics == (fltSemantics *)semPPCDoubleDouble)) {
      detail::DoubleAPFloat::operator=((DoubleAPFloat *)this,(DoubleAPFloat *)&RHS->IEEE);
    }
    else if ((Storage *)this != RHS) {
      ~Storage(this);
      if (RHS->semantics == (fltSemantics *)semPPCDoubleDouble) {
        detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)this,(DoubleAPFloat *)&RHS->IEEE);
      }
      else {
        detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,&RHS->IEEE);
      }
    }
  }
  else {
    detail::IEEEFloat::operator=((IEEEFloat *)this,&RHS->IEEE);
  }
  return (Storage *)this;
}

Assistant:

Storage &operator=(const Storage &RHS) {
      if (usesLayout<IEEEFloat>(*semantics) &&
          usesLayout<IEEEFloat>(*RHS.semantics)) {
        IEEE = RHS.IEEE;
      } else if (usesLayout<DoubleAPFloat>(*semantics) &&
                 usesLayout<DoubleAPFloat>(*RHS.semantics)) {
        Double = RHS.Double;
      } else if (this != &RHS) {
        this->~Storage();
        new (this) Storage(RHS);
      }
      return *this;
    }